

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vec3f pos,Vec3f center,Vec3f up,float fovy,float aspect)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 in_XMM4_Qb;
  Vec3f VVar20;
  Vec3f local_1d0;
  Vec3f local_1c0;
  Vec3f local_1b0;
  Vec3f local_1a0;
  Vec3f local_190;
  undefined8 local_180;
  float local_178;
  float local_170;
  float local_16c;
  float dim_x;
  float dim_y;
  float local_160;
  Vec3f local_158;
  Vec3f local_148;
  undefined1 local_138 [8];
  Vec3f dy;
  Vec3f local_f8;
  Vec3f local_e8;
  undefined1 local_d8 [8];
  Vec3f dx;
  undefined1 local_b8 [8];
  Vec3f dz;
  Vec3f local_88;
  float local_78;
  float local_74;
  float aspect_local;
  float fovy_local;
  PerspectiveCamera *this_local;
  float local_60;
  PerspectiveCamera *local_58;
  Vec3f up_local;
  undefined1 local_38 [8];
  Vec3f center_local;
  undefined1 local_18 [8];
  Vec3f pos_local;
  
  local_60 = up.z;
  center_local.x = center.z;
  auVar19._8_56_ = center._8_56_;
  auVar19._0_8_ = center._0_8_;
  pos_local.x = pos.z;
  auVar4._8_56_ = pos._8_56_;
  auVar4._0_8_ = pos._0_8_;
  unique0x00006b80 = vmovlpd_avx(auVar4._0_16_);
  unique0x00006b80 = vmovlpd_avx(auVar19._0_16_);
  auVar2._8_8_ = in_XMM4_Qb;
  auVar2._0_8_ = up._0_8_;
  this_local = (PerspectiveCamera *)vmovlpd_avx(auVar2);
  (this->pos).z = pos_local.x;
  (this->pos).x = (float)unique0x00006b80;
  (this->pos).y = SUB84(unique0x00006b80,4);
  local_78 = aspect;
  local_74 = fovy;
  _aspect_local = this;
  local_58 = this_local;
  up_local.x = local_60;
  local_38 = (undefined1  [8])unique0x00006b80;
  local_18 = (undefined1  [8])unique0x00006b80;
  VVar20 = operator-((Vec3f *)local_38,(Vec3f *)local_18);
  local_88.z = VVar20.z;
  auVar5._0_8_ = VVar20._0_8_;
  auVar5._8_56_ = auVar4._8_56_;
  local_88._0_8_ = vmovlpd_avx(auVar5._0_16_);
  VVar20 = Vec3f::normalized(&local_88);
  auVar6._0_8_ = VVar20._0_8_;
  auVar6._8_56_ = auVar4._8_56_;
  unique0x00006b80 = vmovlpd_avx(auVar6._0_16_);
  (this->dir).z = VVar20.z;
  (this->dir).x = (float)(int)unique0x00006b80;
  (this->dir).y = (float)(int)((ulong)unique0x00006b80 >> 0x20);
  (this->up).z = up_local.x;
  *(PerspectiveCamera **)&this->up = local_58;
  Vec3f::Vec3f(&this->dir_top_left,0.0,0.0,0.0);
  Vec3f::Vec3f(&this->screen_du,0.0,0.0,0.0);
  auVar4._8_56_ = ZEXT856(0);
  Vec3f::Vec3f(&this->screen_dv,0.0,0.0,0.0);
  VVar20 = Vec3f::normalized(&this->dir);
  dz.x = VVar20.z;
  auVar7._0_8_ = VVar20._0_8_;
  auVar7._8_56_ = auVar4._8_56_;
  unique0x00006b80 = vmovlpd_avx(auVar7._0_16_);
  local_b8 = (undefined1  [8])unique0x00006b80;
  VVar20 = Vec3f::cross((Vec3f *)local_b8,(Vec3f *)&local_58);
  local_f8.z = VVar20.z;
  auVar8._0_8_ = VVar20._0_8_;
  auVar8._8_56_ = auVar4._8_56_;
  local_f8._0_8_ = vmovlpd_avx(auVar8._0_16_);
  VVar20 = Vec3f::normalized(&local_f8);
  local_e8.z = VVar20.z;
  auVar9._0_8_ = VVar20._0_8_;
  auVar9._8_56_ = auVar4._8_56_;
  local_e8._0_8_ = vmovlpd_avx(auVar9._0_16_);
  VVar20 = operator-(&local_e8);
  dx.x = VVar20.z;
  auVar10._0_8_ = VVar20._0_8_;
  auVar10._8_56_ = auVar4._8_56_;
  unique0x00006b80 = vmovlpd_avx(auVar10._0_16_);
  local_d8 = (undefined1  [8])unique0x00006b80;
  VVar20 = Vec3f::cross((Vec3f *)local_d8,(Vec3f *)local_b8);
  local_158.z = VVar20.z;
  auVar11._0_8_ = VVar20._0_8_;
  auVar11._8_56_ = auVar4._8_56_;
  local_158._0_8_ = vmovlpd_avx(auVar11._0_16_);
  local_148._0_8_ = local_158._0_8_;
  local_148.z = local_158.z;
  VVar20 = Vec3f::normalized(&local_148);
  local_160 = VVar20.z;
  auVar12._0_8_ = VVar20._0_8_;
  auVar12._8_56_ = auVar4._8_56_;
  _dim_x = vmovlpd_avx(auVar12._0_16_);
  local_138 = (undefined1  [8])_dim_x;
  dy.x = local_160;
  dVar3 = std::sin((double)(ulong)(uint)(local_74 * 0.5 * 0.017453292));
  local_16c = SUB84(dVar3,0) + SUB84(dVar3,0);
  local_170 = local_16c * local_78;
  auVar4._8_56_ = (undefined1  [56])0x0;
  VVar20 = operator*(local_170 * 0.5,(Vec3f *)local_d8);
  local_1b0.z = VVar20.z;
  auVar13._0_8_ = VVar20._0_8_;
  auVar13._8_56_ = auVar4._8_56_;
  local_1b0._0_8_ = vmovlpd_avx(auVar13._0_16_);
  local_1a0._0_8_ = local_1b0._0_8_;
  local_1a0.z = local_1b0.z;
  VVar20 = operator-((Vec3f *)local_b8,&local_1a0);
  local_1c0.z = VVar20.z;
  auVar14._0_8_ = VVar20._0_8_;
  auVar14._8_56_ = auVar4._8_56_;
  local_1c0._0_8_ = vmovlpd_avx(auVar14._0_16_);
  auVar4._8_56_ = (undefined1  [56])0x0;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  VVar20 = operator*(local_16c * 0.5,(Vec3f *)local_138);
  local_1d0.z = VVar20.z;
  auVar15._0_8_ = VVar20._0_8_;
  auVar15._8_56_ = auVar4._8_56_;
  local_1d0._0_8_ = vmovlpd_avx(auVar15._0_16_);
  VVar20 = operator-(&local_190,&local_1d0);
  local_178 = VVar20.z;
  auVar16._0_8_ = VVar20._0_8_;
  auVar16._8_56_ = auVar4._8_56_;
  local_180 = vmovlpd_avx(auVar16._0_16_);
  (this->dir_top_left).z = local_178;
  (this->dir_top_left).x = (float)(int)local_180;
  (this->dir_top_left).y = (float)(int)((ulong)local_180 >> 0x20);
  auVar4._8_56_ = (undefined1  [56])0x0;
  VVar20 = operator*((Vec3f *)local_d8,local_170);
  auVar17._0_8_ = VVar20._0_8_;
  auVar17._8_56_ = auVar4._8_56_;
  uVar1 = vmovlpd_avx(auVar17._0_16_);
  (this->screen_du).z = VVar20.z;
  (this->screen_du).x = (float)(int)uVar1;
  (this->screen_du).y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar4._8_56_ = (undefined1  [56])0x0;
  VVar20 = operator*((Vec3f *)local_138,local_16c);
  auVar18._0_8_ = VVar20._0_8_;
  auVar18._8_56_ = auVar4._8_56_;
  uVar1 = vmovlpd_avx(auVar18._0_16_);
  (this->screen_dv).x = (float)(int)uVar1;
  (this->screen_dv).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->screen_dv).z = VVar20.z;
  return;
}

Assistant:

PerspectiveCamera::PerspectiveCamera(Vec3f pos, Vec3f center, Vec3f up, float fovy, float aspect)
	: pos(pos), dir((center - pos).normalized()), up(up)
{
	Vec3f dz = dir.normalized();
	Vec3f dx = -dz.cross(up).normalized();
	Vec3f dy = dx.cross(dz).normalized();
	float dim_y = 2.f * std::sin((fovy / 2.f) * (static_cast<float>(M_PI) / 180.f));
	float dim_x = dim_y * aspect;
	dir_top_left = dz - 0.5f * dim_x * dx - 0.5f * dim_y * dy;
	screen_du = dx * dim_x;
	screen_dv = dy * dim_y;
}